

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::AddFoldedRange(CharClassBuilder *cc,Rune lo,Rune hi,int depth)

{
  bool bVar1;
  ostream *poVar2;
  CaseFold *pCVar3;
  int in_ECX;
  int in_EDX;
  Rune in_ESI;
  Rune hi1;
  Rune lo1;
  CaseFold *f;
  LogMessage *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  LogMessage *in_stack_fffffffffffffe80;
  Rune in_stack_ffffffffffffff50;
  Rune in_stack_ffffffffffffff54;
  CharClassBuilder *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffffe4;
  Rune in_stack_ffffffffffffffe8;
  
  if (in_ECX < 0xb) {
    bVar1 = CharClassBuilder::AddRange
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                      );
    if (bVar1) {
      while ((in_ESI <= in_EDX &&
             (pCVar3 = LookupCaseFold((CaseFold *)unicode_casefold,0x164,in_ESI),
             pCVar3 != (CaseFold *)0x0))) {
        if (in_ESI < pCVar3->lo) {
          in_ESI = pCVar3->lo;
        }
        else {
          std::min<int>((int *)&stack0xfffffffffffffff0,&pCVar3->hi);
          AddFoldedRange((CharClassBuilder *)CONCAT44(in_ESI,in_EDX),in_ECX,
                         in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
          in_ESI = pCVar3->hi + 1;
        }
      }
    }
  }
  else {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
    poVar2 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
    std::operator<<(poVar2,"AddFoldedRange recurses too much.");
    LogMessage::~LogMessage(in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

static void AddFoldedRange(CharClassBuilder* cc, Rune lo, Rune hi, int depth) {
  // AddFoldedRange calls itself recursively for each rune in the fold cycle.
  // Most folding cycles are small: there aren't any bigger than four in the
  // current Unicode tables.  make_unicode_casefold.py checks that
  // the cycles are not too long, and we double-check here using depth.
  if (depth > 10) {
    LOG(DFATAL) << "AddFoldedRange recurses too much.";
    return;
  }

  if (!cc->AddRange(lo, hi))  // lo-hi was already there? we're done
    return;

  while (lo <= hi) {
    const CaseFold* f = LookupCaseFold(unicode_casefold, num_unicode_casefold, lo);
    if (f == NULL)  // lo has no fold, nor does anything above lo
      break;
    if (lo < f->lo) {  // lo has no fold; next rune with a fold is f->lo
      lo = f->lo;
      continue;
    }

    // Add in the result of folding the range lo - f->hi
    // and that range's fold, recursively.
    Rune lo1 = lo;
    Rune hi1 = std::min<Rune>(hi, f->hi);
    switch (f->delta) {
      default:
        lo1 += f->delta;
        hi1 += f->delta;
        break;
      case EvenOdd:
        if (lo1%2 == 1)
          lo1--;
        if (hi1%2 == 0)
          hi1++;
        break;
      case OddEven:
        if (lo1%2 == 0)
          lo1--;
        if (hi1%2 == 1)
          hi1++;
        break;
    }
    AddFoldedRange(cc, lo1, hi1, depth+1);

    // Pick up where this fold left off.
    lo = f->hi + 1;
  }
}